

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_window.cpp
# Opt level: O3

void __thiscall
duckdb::StreamingWindowState::LeadLagState::ExecuteLag
          (LeadLagState *this,ExecutionContext *context,DataChunk *input,Vector *result)

{
  DataChunk *this_00;
  Vector *source;
  Vector *vector;
  ulong source_count;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  reference source_00;
  ulong uVar2;
  idx_t source_count_00;
  idx_t source_count_01;
  
  this_00 = &this->curr_chunk;
  source_00 = vector<duckdb::Vector,_true>::operator[](&this_00->data,0);
  DataChunk::Reset(this_00);
  ExpressionExecutor::Execute(&this->executor,input,this_00);
  source_count = input->count;
  uVar2 = this->buffered;
  if (source_count <= this->buffered) {
    uVar2 = source_count;
  }
  source = &this->prev;
  VectorOperations::Copy(source,result,uVar2,0,0);
  uVar2 = this->buffered;
  source_count_01 = source_count - uVar2;
  if (source_count < uVar2) {
    vector = &this->temp;
    FlatVector::VerifyFlatVector(vector);
    (this->temp).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)0x0;
    (this->temp).validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    p_Var1 = (this->temp).validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
             .
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (this->temp).validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    (this->temp).validity.super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
    VectorOperations::Copy(source,vector,this->buffered,uVar2 - source_count,0);
    FlatVector::VerifyFlatVector(source);
    (this->prev).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)0x0;
    (this->prev).validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    p_Var1 = (this->prev).validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
             .
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (this->prev).validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    (this->prev).validity.super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
    VectorOperations::Copy(vector,source,source_count,0,0);
    source_count_01 = 0;
    source_count_00 = uVar2 - source_count;
    uVar2 = source_count;
  }
  else {
    VectorOperations::Copy(source_00,result,source_count_01,0,uVar2);
    FlatVector::VerifyFlatVector(source);
    (this->prev).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)0x0;
    (this->prev).validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    p_Var1 = (this->prev).validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
             .
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (this->prev).validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    (this->prev).validity.super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
    uVar2 = 0;
    source_count_00 = source_count;
  }
  VectorOperations::Copy(source_00,source,source_count_00,source_count_01,uVar2);
  return;
}

Assistant:

void ExecuteLag(ExecutionContext &context, DataChunk &input, Vector &result) {
			D_ASSERT(offset >= 0);
			auto &curr = curr_chunk.data[0];
			curr_chunk.Reset();
			executor.Execute(input, curr_chunk);
			const idx_t count = input.size();
			//	Copy prev[0, buffered] => result[0, buffered]
			idx_t source_count = MinValue<idx_t>(buffered, count);
			VectorOperations::Copy(prev, result, source_count, 0, 0);
			// Special case when we have buffered enough values for the output
			if (count < buffered) {
				//	Shift down incomplete buffers
				// 	Copy prev[buffered-count, buffered] => temp[0, count]
				source_count = buffered - count;
				FlatVector::Validity(temp).Reset();
				VectorOperations::Copy(prev, temp, buffered, source_count, 0);

				// 	Copy temp[0, count] => prev[0, count]
				FlatVector::Validity(prev).Reset();
				VectorOperations::Copy(temp, prev, count, 0, 0);
				// 	Copy curr[0, buffered-count] => prev[count, buffered]
				VectorOperations::Copy(curr, prev, source_count, 0, count);
			} else {
				//	Copy input values beyond what we have buffered
				source_count = count - buffered;
				//	Copy curr[0, count-buffered] => result[buffered, count]
				VectorOperations::Copy(curr, result, source_count, 0, buffered);
				// 	Copy curr[count-buffered, count] => prev[0, buffered]
				FlatVector::Validity(prev).Reset();
				VectorOperations::Copy(curr, prev, count, source_count, 0);
			}
		}